

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::renderPrep(Sandbox *this)

{
  socklen_t sVar1;
  bool bVar2;
  uint32_t _width;
  uint32_t _height;
  size_type sVar3;
  pointer _name;
  pointer ppVar4;
  size_type sVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  socklen_t __len;
  undefined8 in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *psVar9;
  sockaddr *__addr;
  int iVar10;
  key_type *__k;
  Uniforms *pUVar11;
  string *_ext;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  key_type local_a0;
  allocator local_79;
  key_type local_78;
  _Self local_58;
  _Self local_50;
  iterator it;
  allocator local_31;
  string local_30;
  Sandbox *local_10;
  Sandbox *this_local;
  
  local_10 = this;
  bVar2 = Tracker::isRunning(&(this->uniforms).tracker);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"render",&local_31);
    Tracker::begin(&(this->uniforms).tracker,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  __len = (socklen_t)in_RCX;
  if ((this->m_initialized & 1U) != 0) {
    Uniforms::update(&this->uniforms);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>_>
            ::size(&(this->uniforms).loadQueue);
    __len = (socklen_t)in_RCX;
    if (sVar3 != 0) {
      std::mutex::lock(&(this->uniforms).loadMutex);
      local_50._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>_>
           ::begin(&(this->uniforms).loadQueue);
      while( true ) {
        __len = (socklen_t)in_RCX;
        local_58._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>_>
             ::end(&(this->uniforms).loadQueue);
        bVar2 = std::operator!=(&local_50,&local_58);
        if (!bVar2) break;
        _name = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>
                ::operator->(&local_50);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>
                 ::operator->(&local_50);
        in_RCX = 1;
        vera::Scene::addTexture
                  (&(this->uniforms).super_Scene,&_name->first,&ppVar4->second,true,true);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>
        ::operator++(&local_50);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Image>_>_>
      ::clear(&(this->uniforms).loadQueue);
      std::mutex::unlock(&(this->uniforms).loadMutex);
    }
  }
  if ((this->m_update_buffers & 1U) == 0) {
    sVar1 = this->m_buffers_total;
    sVar5 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&(this->uniforms).buffers);
    __len = (socklen_t)sVar5;
    if (sVar1 == __len) {
      sVar1 = this->m_doubleBuffers_total;
      sVar5 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                        (&(this->uniforms).doubleBuffers);
      __len = (socklen_t)sVar5;
      if (sVar1 == __len) goto LAB_0035e554;
    }
  }
  _updateBuffers(this);
LAB_0035e554:
  sVar5 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&(this->uniforms).buffers);
  if ((((sVar5 != 0) ||
       (sVar5 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                          (&(this->uniforms).doubleBuffers), sVar5 != 0)) ||
      (0 < this->m_pyramid_total)) || (0 < this->m_flood_total)) {
    _renderBuffers(this);
  }
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
          ::size(&(this->uniforms).super_Scene.models);
  if (sVar6 != 0) {
    SceneRender::renderShadowMap(&this->m_sceneRender,&this->uniforms);
  }
  bVar2 = std::operator!=(&this->screenshotFile,"");
  if (((bVar2) || (bVar2 = isRecording(), bVar2)) &&
     (bVar2 = vera::Fbo::isAllocated(&this->m_record_fbo), !bVar2)) {
    _width = vera::getWindowWidth();
    _height = vera::getWindowHeight();
    __len = 1;
    vera::Fbo::allocate(&this->m_record_fbo,_width,_height,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR,REPEAT,
                        true);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"u_sceneNormal",&local_79);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](&(this->uniforms).functions,&local_78);
  bVar2 = pmVar7->present;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if ((bVar2 & 1U) != 0) {
    SceneRender::renderNormalBuffer(&this->m_sceneRender,&this->uniforms);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"u_scenePosition",&local_a1);
  __k = &local_a0;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](&(this->uniforms).functions,__k);
  iVar10 = (int)__k;
  bVar2 = pmVar7->present;
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  if ((bVar2 & 1U) != 0) {
    pUVar11 = &this->uniforms;
    SceneRender::renderPositionBuffer(&this->m_sceneRender,pUVar11);
    iVar10 = (int)pUVar11;
  }
  sVar8 = SceneRender::getBuffersTotal(&this->m_sceneRender);
  psVar9 = extraout_RDX;
  if (sVar8 != 0) {
    pUVar11 = &this->uniforms;
    SceneRender::renderBuffers(&this->m_sceneRender,pUVar11);
    iVar10 = (int)pUVar11;
    psVar9 = extraout_RDX_00;
  }
  if ((((this->m_postprocessing & 1U) == 0) && (this->m_plot != PLOT_LUMA)) &&
     ((this->m_plot != PLOT_RGB &&
      (((this->m_plot != PLOT_RED && (this->m_plot != PLOT_GREEN)) && (this->m_plot != PLOT_BLUE))))
     )) {
    iVar10 = 0x6080fe;
    bVar2 = std::operator!=(&this->screenshotFile,"");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"png",&local_c9);
      _ext = &local_c8;
      bVar2 = vera::haveExt(&this->screenshotFile,_ext);
      iVar10 = (int)_ext;
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      psVar9 = extraout_RDX_01;
      if (bVar2) {
        glEnable(0xbe2);
        iVar10 = 0x303;
        glBlendFunc(1);
        psVar9 = extraout_RDX_02;
      }
      vera::Fbo::bind(&this->m_record_fbo,iVar10,psVar9,__len);
    }
    else {
      bVar2 = isRecording();
      if (bVar2) {
        vera::Fbo::bind(&this->m_record_fbo,iVar10,__addr,__len);
      }
    }
  }
  else {
    vera::Fbo::bind(&(this->m_sceneRender).renderFbo,iVar10,psVar9,__len);
  }
  glClear(0x4100);
  return;
}

Assistant:

void Sandbox::renderPrep() {
    TRACK_BEGIN("render")

    // UPDATE STREAMING TEXTURES
    // -----------------------------------------------
    if (m_initialized) {
        uniforms.update();
        if (uniforms.loadQueue.size() > 0) {
            uniforms.loadMutex.lock();
            for (ImagesMap::iterator it = uniforms.loadQueue.begin(); it != uniforms.loadQueue.end(); ++it)
                uniforms.addTexture( it->first, it->second );
            uniforms.loadQueue.clear();
            uniforms.loadMutex.unlock();
        }
    }

    // BUFFERS
    // -----------------------------------------------
    if (m_update_buffers ||
        m_buffers_total != int(uniforms.buffers.size()) ||
        m_doubleBuffers_total != int(uniforms.doubleBuffers.size()) )
        _updateBuffers();
    
    if (uniforms.buffers.size() > 0 || 
        uniforms.doubleBuffers.size() > 0 ||
        m_pyramid_total > 0 ||
        m_flood_total > 0)
        _renderBuffers();

    // RENDER SHADOW MAP
    // -----------------------------------------------
    if (uniforms.models.size() > 0)
        m_sceneRender.renderShadowMap(uniforms);
    
    // MAIN SCENE
    // ----------------------------------------------- < main scene start
    if (screenshotFile != "" || isRecording() )
        if (!m_record_fbo.isAllocated())
            m_record_fbo.allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::COLOR_TEXTURE_DEPTH_BUFFER);

    if (uniforms.functions["u_sceneNormal"].present)
        m_sceneRender.renderNormalBuffer(uniforms);

    if (uniforms.functions["u_scenePosition"].present)
        m_sceneRender.renderPositionBuffer(uniforms);

    if (m_sceneRender.getBuffersTotal() != 0)
        m_sceneRender.renderBuffers(uniforms);

    if (m_postprocessing || m_plot == PLOT_LUMA || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE ) {
        m_sceneRender.renderFbo.bind();
    }
    else if (screenshotFile != "") {
        if (vera::haveExt(screenshotFile, "png")) {
            glEnable(GL_BLEND);
            glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
        }
        m_record_fbo.bind();
    }
    else if (isRecording())
        m_record_fbo.bind();

    // Clear the background
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
}